

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  SectionNode *pSVar1;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *pNVar2;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  value_type local_28;
  
  pNVar2 = (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *)
           operator_new(0x1b8);
  (pNVar2->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (pNVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_00168a80;
  TestCaseStats::TestCaseStats(&pNVar2->value,testCaseStats);
  (pNVar2->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar2->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar2->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.m_p = pNVar2;
  (*(pNVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])
            (pNVar2);
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AxelStrem[P]local_ptr/test/catch.hpp"
                  ,0x2236,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&pNVar2->children,&this->m_rootSection);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::push_back(&this->m_testCases,&local_28);
  pSVar1 = (this->m_rootSection).m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  (this->m_rootSection).m_p = (SectionNode *)0x0;
  pSVar1 = (this->m_deepestSection).m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    std::__cxx11::string::_M_assign((string *)&pSVar1->stdOut);
    std::__cxx11::string::_M_assign((string *)&((this->m_deepestSection).m_p)->stdErr);
    if (local_28.m_p !=
        (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *)0x0) {
      (*((local_28.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[3])();
    }
    return;
  }
  __assert_fail("m_deepestSection",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AxelStrem[P]local_ptr/test/catch.hpp"
                ,0x223b,
                "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)");
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            Ptr<TestCaseNode> node = new TestCaseNode( testCaseStats );
            assert( m_sectionStack.size() == 0 );
            node->children.push_back( m_rootSection );
            m_testCases.push_back( node );
            m_rootSection.reset();

            assert( m_deepestSection );
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }